

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort_bubble.cpp
# Opt level: O2

int main(void)

{
  bool bVar1;
  int iVar2;
  int aiStack_fb8 [1000];
  
  iVar2 = 0x65;
  do {
    iVar2 = iVar2 + -1;
    if (iVar2 == 0) {
      std::operator<<((ostream *)&std::cout,"Successfully sorted using bubble sort! \n");
      return 0;
    }
    generate_random_arrs(aiStack_fb8,1000);
    bubble_sort<int>(aiStack_fb8,1000);
    bVar1 = std::is_sorted<int*>(aiStack_fb8,(int *)&stack0xffffffffffffffe8);
  } while (bVar1);
  __assert_fail("std::is_sorted(arr, arr + n)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wasimusu[P]cpp_algorithms/sorting/sort_bubble.cpp"
                ,0x42,"int main()");
}

Assistant:

int main() {
    int n = 1000;
    int arr[n];
    for (int _ = 0; _ < 100; _++) {
        generate_random_arrs(arr, n);
        bubble_sort(arr, n);
        assert(std::is_sorted(arr, arr + n));
    }
    std::cout << "Successfully sorted using bubble sort! \n";
    return 0;
}